

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O2

void subtract_average_avx2
               (uint16_t *src_ptr,int16_t *dst_ptr,int width,int height,int round_offset,
               int num_pel_log2)

{
  undefined1 auVar1 [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  __m256i *src;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  
  pauVar3 = (undefined1 (*) [32])(src_ptr + (ulong)(uint)(height * 2) * 0x10);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  pauVar4 = (undefined1 (*) [32])src_ptr;
  pauVar2 = (undefined1 (*) [32])src_ptr;
  do {
    while( true ) {
      auVar5 = vpaddw_avx2(pauVar4[2],*pauVar4);
      auVar7 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar8 = vpunpcklwd_avx2(auVar5,auVar7);
      auVar5 = vpunpckhwd_avx2(auVar5,auVar7);
      auVar5 = vpaddd_avx2(auVar6._0_32_,auVar5);
      auVar5 = vpaddd_avx2(auVar5,auVar8);
      auVar6 = ZEXT3264(auVar5);
      if (width == 0x20) break;
      pauVar4 = pauVar4 + 4;
      if (pauVar3 <= pauVar4) goto LAB_003acaae;
    }
    auVar8 = vpaddw_avx2(pauVar2[3],pauVar2[1]);
    auVar1 = vpunpcklwd_avx2(auVar8,auVar7);
    auVar8 = vpunpckhwd_avx2(auVar8,auVar7);
    auVar8 = vpaddd_avx2(auVar9._0_32_,auVar8);
    auVar8 = vpaddd_avx2(auVar8,auVar1);
    auVar9 = ZEXT3264(auVar8);
    pauVar4 = pauVar2 + 4;
    pauVar2 = pauVar4;
  } while (pauVar4 < pauVar3);
  auVar5 = vpaddd_avx2(auVar8,auVar5);
LAB_003acaae:
  auVar5 = vphaddd_avx2(auVar5,auVar5);
  auVar5 = vpermq_avx2(auVar5,0xd8);
  auVar5 = vphaddd_avx2(auVar5,auVar5);
  auVar5 = vphaddd_avx2(auVar5,auVar5);
  auVar8._4_4_ = round_offset;
  auVar8._0_4_ = round_offset;
  auVar8._8_4_ = round_offset;
  auVar8._12_4_ = round_offset;
  auVar8._16_4_ = round_offset;
  auVar8._20_4_ = round_offset;
  auVar8._24_4_ = round_offset;
  auVar8._28_4_ = round_offset;
  auVar5 = vpaddd_avx2(auVar5,auVar8);
  auVar5 = vpsrld_avx2(auVar5,ZEXT416((uint)num_pel_log2));
  auVar5 = vpackssdw_avx2(auVar5,auVar5);
  pauVar4 = (undefined1 (*) [32])(dst_ptr + 0x10);
  do {
    auVar8 = vpsubw_avx2(*(undefined1 (*) [32])src_ptr,auVar5);
    pauVar4[-1] = auVar8;
    if (width == 0x20) {
      auVar8 = vpsubw_avx2(*(undefined1 (*) [32])((long)src_ptr + 0x20),auVar5);
      *pauVar4 = auVar8;
    }
    src_ptr = (uint16_t *)((long)src_ptr + 0x40);
    pauVar4 = pauVar4 + 2;
  } while (src_ptr < pauVar3);
  return;
}

Assistant:

static inline void subtract_average_avx2(const uint16_t *src_ptr,
                                         int16_t *dst_ptr, int width,
                                         int height, int round_offset,
                                         int num_pel_log2) {
  // Use SSE2 version for smaller widths
  assert(width == 16 || width == 32);

  const __m256i *src = (__m256i *)src_ptr;
  const __m256i *const end = src + height * CFL_BUF_LINE_I256;
  // To maximize usage of the AVX2 registers, we sum two rows per loop
  // iteration
  const int step = 2 * CFL_BUF_LINE_I256;

  __m256i sum = _mm256_setzero_si256();
  // For width 32, we use a second sum accumulator to reduce accumulator
  // dependencies in the loop.
  __m256i sum2;
  if (width == 32) sum2 = _mm256_setzero_si256();

  do {
    // Add top row to the bottom row
    __m256i l0 = _mm256_add_epi16(_mm256_loadu_si256(src),
                                  _mm256_loadu_si256(src + CFL_BUF_LINE_I256));
    sum = _mm256_add_epi32(sum, _mm256_addl_epi16(l0));
    if (width == 32) { /* Don't worry, this if it gets optimized out. */
      // Add the second part of the top row to the second part of the bottom row
      __m256i l1 =
          _mm256_add_epi16(_mm256_loadu_si256(src + 1),
                           _mm256_loadu_si256(src + 1 + CFL_BUF_LINE_I256));
      sum2 = _mm256_add_epi32(sum2, _mm256_addl_epi16(l1));
    }
    src += step;
  } while (src < end);
  // Combine both sum accumulators
  if (width == 32) sum = _mm256_add_epi32(sum, sum2);

  __m256i fill = fill_sum_epi32(sum);

  __m256i avg_epi16 = _mm256_srli_epi32(
      _mm256_add_epi32(fill, _mm256_set1_epi32(round_offset)), num_pel_log2);
  avg_epi16 = _mm256_packs_epi32(avg_epi16, avg_epi16);

  // Store and subtract loop
  src = (__m256i *)src_ptr;
  __m256i *dst = (__m256i *)dst_ptr;
  do {
    _mm256_storeu_si256(dst,
                        _mm256_sub_epi16(_mm256_loadu_si256(src), avg_epi16));
    if (width == 32) {
      _mm256_storeu_si256(
          dst + 1, _mm256_sub_epi16(_mm256_loadu_si256(src + 1), avg_epi16));
    }
    src += CFL_BUF_LINE_I256;
    dst += CFL_BUF_LINE_I256;
  } while (src < end);
}